

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void file_callback(log_Event *ev)

{
  size_t sVar1;
  char local_58 [8];
  char buf [64];
  log_Event *ev_local;
  
  sVar1 = strftime(local_58,0x40,"%Y-%m-%d %H:%M:%S",(tm *)ev->time);
  local_58[sVar1] = '\0';
  fprintf((FILE *)ev->udata,"%s %-5s %s:%d: ",local_58,level_strings[ev->level],ev->file,
          (ulong)(uint)ev->line);
  vfprintf((FILE *)ev->udata,ev->fmt,ev);
  fprintf((FILE *)ev->udata,"\n");
  fflush((FILE *)ev->udata);
  return;
}

Assistant:

static void file_callback(log_Event *ev) {
  char buf[64];
  buf[strftime(buf, sizeof(buf), "%Y-%m-%d %H:%M:%S", ev->time)] = '\0';
  fprintf(
    ev->udata, "%s %-5s %s:%d: ",
    buf, level_strings[ev->level], ev->file, ev->line);
  vfprintf(ev->udata, ev->fmt, ev->ap);
  fprintf(ev->udata, "\n");
  fflush(ev->udata);
}